

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng_util.cpp
# Opt level: O2

uint lodepng::getChrmMatrixXYZ
               (float *m,float wX,float wY,float wZ,float rX,float rY,float rZ,float gX,float gY,
               float gZ,float bX,float bY,float bZ)

{
  uint uVar1;
  float bs;
  float gs;
  float rs;
  float local_98;
  float local_88;
  float local_78;
  float local_68;
  float local_58;
  float t [9];
  
  t[2] = bX;
  t[5] = bY;
  t[7] = gZ;
  t[8] = bZ;
  local_98 = rY;
  local_88 = gX;
  local_78 = rX;
  local_68 = rZ;
  local_58 = gY;
  t[0] = rX;
  t[1] = gX;
  t[3] = rY;
  t[4] = gY;
  t[6] = rZ;
  uVar1 = invMatrix(t);
  if (uVar1 == 0) {
    mulMatrix(&rs,&gs,&bs,t,(double)wX,(double)wY,(double)wZ);
    *m = local_78 * rs;
    m[1] = local_88 * gs;
    m[2] = bX * bs;
    m[3] = local_98 * rs;
    m[4] = local_58 * gs;
    m[5] = bY * bs;
    m[6] = local_68 * rs;
    m[7] = gZ * gs;
    m[8] = bZ * bs;
  }
  return (uint)(uVar1 != 0);
}

Assistant:

static unsigned getChrmMatrixXYZ(float* m,
                                 float wX, float wY, float wZ,
                                 float rX, float rY, float rZ,
                                 float gX, float gY, float gZ,
                                 float bX, float bY, float bZ) {
  float t[9];
  float rs, gs, bs;
  t[0] = rX; t[1] = gX; t[2] = bX;
  t[3] = rY; t[4] = gY; t[5] = bY;
  t[6] = rZ; t[7] = gZ; t[8] = bZ;
  if(invMatrix(t)) return 1; /* error, not invertible */
  mulMatrix(&rs, &gs, &bs, t, wX, wY, wZ);
  m[0] = rs * rX; m[1] = gs * gX; m[2] = bs * bX;
  m[3] = rs * rY; m[4] = gs * gY; m[5] = bs * bY;
  m[6] = rs * rZ; m[7] = gs * gZ; m[8] = bs * bZ;
  return 0;
}